

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslAttributes.cpp
# Opt level: O1

TAttributeType __thiscall
glslang::HlslParseContext::attributeFromName
          (HlslParseContext *this,TString *nameSpace,TString *name)

{
  int iVar1;
  TAttributeType TVar2;
  
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(nameSpace,"vk");
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(name,"input_attachment_index");
    if (iVar1 == 0) {
      return EatInputAttachment;
    }
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(name,"location");
    if (iVar1 == 0) {
      return EatLocation;
    }
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(name,"binding");
    if (iVar1 == 0) {
      return EatBinding;
    }
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(name,"global_cbuffer_binding");
    if (iVar1 == 0) {
      return EatGlobalBinding;
    }
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(name,"builtin");
    if (iVar1 == 0) {
      return EatBuiltIn;
    }
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(name,"constant_id");
    if (iVar1 == 0) {
      return EatConstantId;
    }
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(name,"push_constant");
    if (iVar1 == 0) {
      return EatPushConstant;
    }
  }
  else {
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(nameSpace,"spv");
    if (iVar1 == 0) {
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rgba32f");
      if (iVar1 == 0) {
        return EatFormatRgba32f;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rgba16f");
      if (iVar1 == 0) {
        return EatFormatRgba16f;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_r32f");
      if (iVar1 == 0) {
        return EatFormatR32f;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rgba8");
      if (iVar1 == 0) {
        return EatFormatRgba8;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rgba8snorm");
      if (iVar1 == 0) {
        return EatFormatRgba8Snorm;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rg32f");
      if (iVar1 == 0) {
        return EatFormatRg32f;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rg16f");
      if (iVar1 == 0) {
        return EatFormatRg16f;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_r11fg11fb10f");
      if (iVar1 == 0) {
        return EatFormatR11fG11fB10f;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_r16f");
      if (iVar1 == 0) {
        return EatFormatR16f;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rgba16");
      if (iVar1 == 0) {
        return EatFormatRgba16;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rgb10a2");
      if (iVar1 == 0) {
        return EatFormatRgb10A2;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rg16");
      if (iVar1 == 0) {
        return EatFormatRg16;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rg8");
      if (iVar1 == 0) {
        return EatFormatRg8;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_r16");
      if (iVar1 == 0) {
        return EatFormatR16;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_r8");
      if (iVar1 == 0) {
        return EatFormatR8;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rgba16snorm");
      if (iVar1 == 0) {
        return EatFormatRgba16Snorm;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rg16snorm");
      if (iVar1 == 0) {
        return EatFormatRg16Snorm;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rg8snorm");
      if (iVar1 == 0) {
        return EatFormatRg8Snorm;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_r16snorm");
      if (iVar1 == 0) {
        return EatFormatR16Snorm;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_r8snorm");
      if (iVar1 == 0) {
        return EatFormatR8Snorm;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rgba32i");
      if (iVar1 == 0) {
        return EatFormatRgba32i;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rgba16i");
      if (iVar1 == 0) {
        return EatFormatRgba16i;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rgba8i");
      if (iVar1 == 0) {
        return EatFormatRgba8i;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_r32i");
      if (iVar1 == 0) {
        return EatFormatR32i;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rg32i");
      if (iVar1 == 0) {
        return EatFormatRg32i;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rg16i");
      if (iVar1 == 0) {
        return EatFormatRg16i;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rg8i");
      if (iVar1 == 0) {
        return EatFormatRg8i;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_r16i");
      if (iVar1 == 0) {
        return EatFormatR16i;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_r8i");
      if (iVar1 == 0) {
        return EatFormatR8i;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rgba32ui");
      if (iVar1 == 0) {
        return EatFormatRgba32ui;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rgba16ui");
      if (iVar1 == 0) {
        return EatFormatRgba16ui;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rgba8ui");
      if (iVar1 == 0) {
        return EatFormatRgba8ui;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_r32ui");
      if (iVar1 == 0) {
        return EatFormatR32ui;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rgb10a2ui");
      if (iVar1 == 0) {
        return EatFormatRgb10a2ui;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rg32ui");
      if (iVar1 == 0) {
        return EatFormatRg32ui;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rg16ui");
      if (iVar1 == 0) {
        return EatFormatRg16ui;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_rg8ui");
      if (iVar1 == 0) {
        return EatFormatRg8ui;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_r16ui");
      if (iVar1 == 0) {
        return EatFormatR16ui;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"format_r8ui");
      if (iVar1 == 0) {
        return EatFormatR8ui;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"nonwritable");
      if (iVar1 == 0) {
        return EatNonWritable;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"nonreadable");
      if (iVar1 == 0) {
        return EatNonReadable;
      }
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"export");
      if (iVar1 == 0) {
        return EatExport;
      }
    }
    else if (nameSpace->_M_string_length != 0) {
      return EatNone;
    }
  }
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(name,"allow_uav_condition");
  if (iVar1 == 0) {
    TVar2 = EatAllow_uav_condition;
  }
  else {
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(name,"branch");
    if (iVar1 == 0) {
      TVar2 = EatBranch;
    }
    else {
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"call");
      if (iVar1 == 0) {
        TVar2 = EatCall;
      }
      else {
        iVar1 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (name,"domain");
        if (iVar1 == 0) {
          TVar2 = EatDomain;
        }
        else {
          iVar1 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(name,"earlydepthstencil");
          if (iVar1 == 0) {
            TVar2 = EatEarlyDepthStencil;
          }
          else {
            iVar1 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(name,"fastopt");
            if (iVar1 == 0) {
              TVar2 = EatFastOpt;
            }
            else {
              iVar1 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(name,"flatten");
              if (iVar1 == 0) {
                TVar2 = EatFlatten;
              }
              else {
                iVar1 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        compare(name,"forcecase");
                if (iVar1 == 0) {
                  TVar2 = EatForceCase;
                }
                else {
                  iVar1 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::compare(name,"instance");
                  if (iVar1 == 0) {
                    TVar2 = EatInstance;
                  }
                  else {
                    iVar1 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::compare(name,"maxtessfactor");
                    if (iVar1 == 0) {
                      TVar2 = EatMaxTessFactor;
                    }
                    else {
                      iVar1 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::compare(name,"maxvertexcount");
                      if (iVar1 == 0) {
                        TVar2 = EatMaxVertexCount;
                      }
                      else {
                        iVar1 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                ::compare(name,"numthreads");
                        if (iVar1 == 0) {
                          TVar2 = EatNumThreads;
                        }
                        else {
                          iVar1 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                  ::compare(name,"outputcontrolpoints");
                          if (iVar1 == 0) {
                            TVar2 = EatOutputControlPoints;
                          }
                          else {
                            iVar1 = std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                    ::compare(name,"outputtopology");
                            if (iVar1 == 0) {
                              TVar2 = EatOutputTopology;
                            }
                            else {
                              iVar1 = std::__cxx11::
                                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      ::compare(name,"partitioning");
                              if (iVar1 == 0) {
                                TVar2 = EatPartitioning;
                              }
                              else {
                                iVar1 = std::__cxx11::
                                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                        ::compare(name,"patchconstantfunc");
                                if (iVar1 == 0) {
                                  TVar2 = EatPatchConstantFunc;
                                }
                                else {
                                  iVar1 = std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                          ::compare(name,"unroll");
                                  if (iVar1 == 0) {
                                    TVar2 = EatUnroll;
                                  }
                                  else {
                                    iVar1 = std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::compare(name,"loop");
                                    TVar2 = EatLoop;
                                    if (iVar1 != 0) {
                                      TVar2 = EatNone;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return TVar2;
}

Assistant:

TAttributeType HlslParseContext::attributeFromName(const TString& nameSpace, const TString& name) const
    {
        // handle names within a namespace

        if (nameSpace == "vk") {
            if (name == "input_attachment_index")
                return EatInputAttachment;
            else if (name == "location")
                return EatLocation;
            else if (name == "binding")
                return EatBinding;
            else if (name == "global_cbuffer_binding")
                return EatGlobalBinding;
            else if (name == "builtin")
                return EatBuiltIn;
            else if (name == "constant_id")
                return EatConstantId;
            else if (name == "push_constant")
                return EatPushConstant;
        } else if (nameSpace == "spv") {
            if (name == "format_rgba32f")       return EatFormatRgba32f;
            if (name == "format_rgba16f")       return EatFormatRgba16f;
            if (name == "format_r32f")          return EatFormatR32f;
            if (name == "format_rgba8")         return EatFormatRgba8;
            if (name == "format_rgba8snorm")    return EatFormatRgba8Snorm;
            if (name == "format_rg32f")         return EatFormatRg32f;
            if (name == "format_rg16f")         return EatFormatRg16f;
            if (name == "format_r11fg11fb10f")  return EatFormatR11fG11fB10f;
            if (name == "format_r16f")          return EatFormatR16f;
            if (name == "format_rgba16")        return EatFormatRgba16;
            if (name == "format_rgb10a2")       return EatFormatRgb10A2;
            if (name == "format_rg16")          return EatFormatRg16;
            if (name == "format_rg8")           return EatFormatRg8;
            if (name == "format_r16")           return EatFormatR16;
            if (name == "format_r8")            return EatFormatR8;
            if (name == "format_rgba16snorm")   return EatFormatRgba16Snorm;
            if (name == "format_rg16snorm")     return EatFormatRg16Snorm;
            if (name == "format_rg8snorm")      return EatFormatRg8Snorm;
            if (name == "format_r16snorm")      return EatFormatR16Snorm;
            if (name == "format_r8snorm")       return EatFormatR8Snorm;
            if (name == "format_rgba32i")       return EatFormatRgba32i;
            if (name == "format_rgba16i")       return EatFormatRgba16i;
            if (name == "format_rgba8i")        return EatFormatRgba8i;
            if (name == "format_r32i")          return EatFormatR32i;
            if (name == "format_rg32i")         return EatFormatRg32i;
            if (name == "format_rg16i")         return EatFormatRg16i;
            if (name == "format_rg8i")          return EatFormatRg8i;
            if (name == "format_r16i")          return EatFormatR16i;
            if (name == "format_r8i")           return EatFormatR8i;
            if (name == "format_rgba32ui")      return EatFormatRgba32ui;
            if (name == "format_rgba16ui")      return EatFormatRgba16ui;
            if (name == "format_rgba8ui")       return EatFormatRgba8ui;
            if (name == "format_r32ui")         return EatFormatR32ui;
            if (name == "format_rgb10a2ui")     return EatFormatRgb10a2ui;
            if (name == "format_rg32ui")        return EatFormatRg32ui;
            if (name == "format_rg16ui")        return EatFormatRg16ui;
            if (name == "format_rg8ui")         return EatFormatRg8ui;
            if (name == "format_r16ui")         return EatFormatR16ui;
            if (name == "format_r8ui")          return EatFormatR8ui;

            if (name == "nonwritable")    return EatNonWritable;
            if (name == "nonreadable")    return EatNonReadable;

            if (name == "export")         return EatExport;
        } else if (nameSpace.size() > 0)
            return EatNone;

        // handle names with no namespace

        if (name == "allow_uav_condition")
            return EatAllow_uav_condition;
        else if (name == "branch")
            return EatBranch;
        else if (name == "call")
            return EatCall;
        else if (name == "domain")
            return EatDomain;
        else if (name == "earlydepthstencil")
            return EatEarlyDepthStencil;
        else if (name == "fastopt")
            return EatFastOpt;
        else if (name == "flatten")
            return EatFlatten;
        else if (name == "forcecase")
            return EatForceCase;
        else if (name == "instance")
            return EatInstance;
        else if (name == "maxtessfactor")
            return EatMaxTessFactor;
        else if (name == "maxvertexcount")
            return EatMaxVertexCount;
        else if (name == "numthreads")
            return EatNumThreads;
        else if (name == "outputcontrolpoints")
            return EatOutputControlPoints;
        else if (name == "outputtopology")
            return EatOutputTopology;
        else if (name == "partitioning")
            return EatPartitioning;
        else if (name == "patchconstantfunc")
            return EatPatchConstantFunc;
        else if (name == "unroll")
            return EatUnroll;
        else if (name == "loop")
            return EatLoop;
        else
            return EatNone;
    }